

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,PerfProfRunHandle *handle)

{
  PerfProfBatch *pPVar1;
  cJSON *root;
  PerfProfRun run;
  PerfProfRun local_78;
  
  pPVar1 = ctx->current_batch;
  local_78.solution.stats[1] = 0.0;
  local_78.solution.stats[2] = 0.0;
  local_78.solution.status = SOLVE_STATUS_NULL;
  local_78.solution._4_4_ = 0;
  local_78.solution.stats[0] = 0.0;
  local_78.solver_name[0x20] = '\0';
  local_78.solver_name[0x21] = '\0';
  local_78.solver_name[0x22] = '\0';
  local_78.solver_name[0x23] = '\0';
  local_78.solver_name[0x24] = '\0';
  local_78.solver_name[0x25] = '\0';
  local_78.solver_name[0x26] = '\0';
  local_78.solver_name[0x27] = '\0';
  local_78.solver_name[0x28] = '\0';
  local_78.solver_name[0x29] = '\0';
  local_78.solver_name[0x2a] = '\0';
  local_78.solver_name[0x2b] = '\0';
  local_78.solver_name[0x2c] = '\0';
  local_78.solver_name[0x2d] = '\0';
  local_78.solver_name[0x2e] = '\0';
  local_78.solver_name[0x2f] = '\0';
  local_78.solver_name[0x10] = '\0';
  local_78.solver_name[0x11] = '\0';
  local_78.solver_name[0x12] = '\0';
  local_78.solver_name[0x13] = '\0';
  local_78.solver_name[0x14] = '\0';
  local_78.solver_name[0x15] = '\0';
  local_78.solver_name[0x16] = '\0';
  local_78.solver_name[0x17] = '\0';
  local_78.solver_name[0x18] = '\0';
  local_78.solver_name[0x19] = '\0';
  local_78.solver_name[0x1a] = '\0';
  local_78.solver_name[0x1b] = '\0';
  local_78.solver_name[0x1c] = '\0';
  local_78.solver_name[0x1d] = '\0';
  local_78.solver_name[0x1e] = '\0';
  local_78.solver_name[0x1f] = '\0';
  local_78.solver_name[0] = '\0';
  local_78.solver_name[1] = '\0';
  local_78.solver_name[2] = '\0';
  local_78.solver_name[3] = '\0';
  local_78.solver_name[4] = '\0';
  local_78.solver_name[5] = '\0';
  local_78.solver_name[6] = '\0';
  local_78.solver_name[7] = '\0';
  local_78.solver_name[8] = '\0';
  local_78.solver_name[9] = '\0';
  local_78.solver_name[10] = '\0';
  local_78.solver_name[0xb] = '\0';
  local_78.solver_name[0xc] = '\0';
  local_78.solver_name[0xd] = '\0';
  local_78.solver_name[0xe] = '\0';
  local_78.solver_name[0xf] = '\0';
  strncpy(local_78.solver_name,handle->solver_name,0x30);
  local_78.solver_name._40_8_ = local_78.solver_name._40_8_ & 0xffffffffffffff;
  local_78.solution.stats[0] = pPVar1->timelimit;
  local_78.solution.stats[0] = local_78.solution.stats[0] + local_78.solution.stats[0];
  local_78.solution.status = SOLVE_STATUS_ERR;
  local_78.solution._4_4_ = 0;
  local_78.solution.stats[1] = 2.0;
  local_78.solution.stats[2] = 0.0;
  if (handle->json_output_path[0] != '\0') {
    root = load_json(handle->json_output_path);
    if (root != (cJSON *)0x0) {
      parse_cptp_solver_json_dump(&local_78,root);
      cJSON_Delete(root);
    }
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,&local_78);
  return;
}

Assistant:

static void
update_perf_tbl_with_cptp_json_perf_data(AppCtx *ctx,
                                         PerfProfRunHandle *handle) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (handle->json_output_path[0] != '\0') {
        cJSON *root = load_json(handle->json_output_path);
        if (root) {
            parse_cptp_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}